

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_error_color(__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                       *eit,vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors,
                      shared_ptr<StringLine> *sl,int column)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  pointer pEVar6;
  enableStd<rang::bg> os;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  local_30;
  int local_24;
  __shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_20;
  int column_local;
  shared_ptr<StringLine> *sl_local;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors_local;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  *eit_local;
  
  local_24 = column;
  p_Stack_20 = (__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)sl;
  sl_local = (shared_ptr<StringLine> *)errors;
  errors_local = (vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)eit;
  local_30._M_current =
       (ErrorInfoException *)
       std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::end(errors);
  bVar1 = __gnu_cxx::operator!=(eit,&local_30);
  if (!bVar1) {
    return;
  }
  peVar5 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_20);
  iVar2 = StringLine::get_line(peVar5);
  pEVar6 = __gnu_cxx::
           __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
           ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                         *)errors_local);
  iVar3 = ErrorInfoException::get_row(pEVar6);
  iVar4 = local_24;
  if (iVar2 == iVar3) {
    pEVar6 = __gnu_cxx::
             __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                           *)errors_local);
    iVar2 = ErrorInfoException::get_column(pEVar6);
    if (iVar4 <= iVar2) goto LAB_00116ae0;
  }
  else {
LAB_00116ae0:
    peVar5 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_20);
    iVar4 = StringLine::get_line(peVar5);
    pEVar6 = __gnu_cxx::
             __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                           *)errors_local);
    iVar2 = ErrorInfoException::get_row(pEVar6);
    if (iVar4 <= iVar2) goto LAB_00116b17;
  }
  __gnu_cxx::
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  ::operator++((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                *)errors_local);
LAB_00116b17:
  pEVar6 = __gnu_cxx::
           __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
           ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                         *)errors_local);
  iVar2 = ErrorInfoException::get_row(pEVar6);
  peVar5 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_20);
  iVar3 = StringLine::get_line(peVar5);
  iVar4 = local_24;
  if (iVar2 == iVar3) {
    pEVar6 = __gnu_cxx::
             __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                           *)errors_local);
    iVar3 = ErrorInfoException::get_column_begin(pEVar6);
    iVar2 = local_24;
    if (iVar3 <= iVar4) {
      pEVar6 = __gnu_cxx::
               __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
               ::operator->((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                             *)errors_local);
      iVar4 = ErrorInfoException::get_column(pEVar6);
      if (iVar2 <= iVar4) {
        os = rang::operator<<((ostream *)&std::cout,red);
        rang::operator<<(os,underline);
      }
    }
  }
  return;
}

Assistant:

void print_error_color(
        __gnu_cxx::__normal_iterator<const ErrorInfoException *, vector<ErrorInfoException, allocator<ErrorInfoException>>> &eit,
        const vector<ErrorInfoException> &errors, const shared_ptr<StringLine> &sl, int column) {
    if (eit != errors.end()) {
        if ((sl->get_line() == eit->get_row() && column > eit->get_column()) || sl->get_line() > eit->get_row())
            ++eit;
        if (eit->get_row() == sl->get_line()) {
            if (column >= eit->get_column_begin() && column <= eit->get_column()) {
                cout << bg::red << style::underline;
            }
        }
    }
}